

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void forbody(LexState *ls,int base,int line,int nvars,int isnum)

{
  FuncState *fs_00;
  LocVar *pLVar1;
  FuncState *pFVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  FuncState *fs;
  long lVar6;
  BlockCnt bl;
  BlockCnt local_40;
  
  fs_00 = ls->fs;
  bVar5 = fs_00->nactvar + 3;
  fs_00->nactvar = bVar5;
  iVar3 = fs_00->pc;
  pLVar1 = fs_00->f->locvars;
  lVar6 = 0;
  do {
    pLVar1[*(ushort *)&fs_00->upvalues[(ulong)bVar5 + lVar6 + 0x39].info].startpc = iVar3;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  checknext(ls,0x103);
  if (isnum == 0) {
    iVar3 = luaK_jump(fs_00);
  }
  else {
    iVar3 = luaK_code(fs_00,base << 6 | 0x7fff8020,fs_00->ls->lastline);
  }
  local_40.breaklist = -1;
  local_40.isbreakable = '\0';
  local_40.nactvar = fs_00->nactvar;
  local_40.upval = '\0';
  local_40.previous = fs_00->bl;
  fs_00->bl = &local_40;
  pFVar2 = ls->fs;
  bVar5 = pFVar2->nactvar + (char)nvars;
  pFVar2->nactvar = bVar5;
  if (nvars != 0) {
    iVar4 = pFVar2->pc;
    pLVar1 = pFVar2->f->locvars;
    lVar6 = -(long)nvars;
    do {
      pLVar1[pFVar2->actvar[(ulong)bVar5 + lVar6]].startpc = iVar4;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0);
  }
  luaK_checkstack(fs_00,nvars);
  fs_00->freereg = fs_00->freereg + nvars;
  block(ls);
  leaveblock(fs_00);
  fs_00->lasttarget = fs_00->pc;
  luaK_concat(fs_00,&fs_00->jpc,iVar3);
  if (isnum == 0) {
    luaK_code(fs_00,base << 6 | nvars << 0xe | 0x21,fs_00->ls->lastline);
    fs_00->f->lineinfo[(long)fs_00->pc + -1] = line;
    iVar4 = luaK_jump(fs_00);
  }
  else {
    iVar4 = luaK_code(fs_00,base << 6 | 0x7fff801f,fs_00->ls->lastline);
    fs_00->f->lineinfo[(long)fs_00->pc + -1] = line;
  }
  luaK_patchlist(fs_00,iVar4,iVar3 + 1);
  return;
}

Assistant:

static void forbody(LexState*ls,int base,int line,int nvars,int isnum){
BlockCnt bl;
FuncState*fs=ls->fs;
int prep,endfor;
adjustlocalvars(ls,3);
checknext(ls,TK_DO);
prep=isnum?luaK_codeAsBx(fs,OP_FORPREP,base,(-1)):luaK_jump(fs);
enterblock(fs,&bl,0);
adjustlocalvars(ls,nvars);
luaK_reserveregs(fs,nvars);
block(ls);
leaveblock(fs);
luaK_patchtohere(fs,prep);
endfor=(isnum)?luaK_codeAsBx(fs,OP_FORLOOP,base,(-1)):
luaK_codeABC(fs,OP_TFORLOOP,base,0,nvars);
luaK_fixline(fs,line);
luaK_patchlist(fs,(isnum?endfor:luaK_jump(fs)),prep+1);
}